

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall rsg::SwizzleOp::evaluate(SwizzleOp *this,ExecutionContext *execCtx)

{
  byte bVar1;
  pointer pSVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  VariableType *this_00;
  long extraout_RDX;
  long lVar5;
  int iVar6;
  
  (*this->m_child->_vptr_Expression[4])();
  iVar3 = (*this->m_child->_vptr_Expression[5])();
  if (0 < (this->m_outValueRange).m_type.m_numElements) {
    pSVar2 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar6 = 0;
    lVar5 = 0;
    do {
      bVar1 = this->m_swizzle[lVar5];
      VariableType::getElementType((VariableType *)CONCAT44(extraout_var,iVar3));
      this_00 = VariableType::getElementType(&(this->m_outValueRange).m_type);
      iVar4 = VariableType::getScalarSize(this_00);
      if ((iVar4 != 0) && (iVar4 << 6 != 0)) {
        memmove(pSVar2 + iVar6,(void *)((ulong)bVar1 * 0x100 + extraout_RDX),(long)(iVar4 << 6) << 2
               );
      }
      lVar5 = lVar5 + 1;
      iVar6 = iVar6 + 0x40;
    } while (lVar5 < (this->m_outValueRange).m_type.m_numElements);
  }
  return;
}

Assistant:

void SwizzleOp::evaluate (ExecutionContext& execCtx)
{
	m_child->evaluate(execCtx);

	ExecConstValueAccess	inValue		= m_child->getValue();
	ExecValueAccess			outValue	= m_value.getValue(m_outValueRange.getType());

	for (int outElemNdx = 0; outElemNdx < outValue.getType().getNumElements(); outElemNdx++)
	{
		int inElemNdx = m_swizzle[outElemNdx];
		outValue.component(outElemNdx) = inValue.component(inElemNdx).value();
	}
}